

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

vector<Post,_std::allocator<Post>_> * __thiscall
Database::getPostsByUserId
          (vector<Post,_std::allocator<Post>_> *__return_storage_ptr__,Database *this,int userId)

{
  int iVar1;
  DatabaseException *this_00;
  char *errorMsg;
  string error;
  string local_80;
  string query;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  errorMsg = (char *)0x0;
  (__return_storage_ptr__->super__Vector_base<Post,_std::allocator<Post>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Post,_std::allocator<Post>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Post,_std::allocator<Post>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::to_string(&local_80,userId);
  std::operator+(&error,"select * from posts where user_id = ",&local_80);
  std::operator+(&query,&error,";");
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string((string *)&local_80);
  iVar1 = sqlite3_exec(this->database,query._M_dataplus._M_p,add_post_callback,
                       __return_storage_ptr__,&errorMsg);
  if (iVar1 == 0) {
    std::__cxx11::string::~string((string *)&query);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&error,errorMsg,(allocator *)&local_80);
  sqlite3_free(errorMsg);
  this_00 = (DatabaseException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_40,"Error while getting posts by user id: ",&error);
  DatabaseException::DatabaseException(this_00,&local_40);
  __cxa_throw(this_00,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
}

Assistant:

std::vector<Post> Database::getPostsByUserId(int userId)
{
	char* errorMsg = nullptr;
	std::vector<Post> result;
	std::string query = "select * from posts where user_id = " + std::to_string(userId) + ";";

	int retval = sqlite3_exec(database, query.c_str(), add_post_callback, &result, &errorMsg);

	if(retval != SQLITE_OK)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while getting posts by user id: " + error);
	}
	else
	{
		return result;
	}
}